

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_typed_array_finalizer(JSRuntime *rt,JSValue val)

{
  long *plVar1;
  JSValueUnion JVar2;
  long lVar3;
  long *plVar4;
  JSValue v;
  
  plVar1 = *(long **)((long)val.u.ptr + 0x30);
  if (plVar1 != (long *)0x0) {
    JVar2 = (JSValueUnion)((JSValueUnion *)(plVar1 + 3))->ptr;
    if ((*(byte *)((long)JVar2.ptr + 5) & 2) == 0) {
      lVar3 = *plVar1;
      plVar4 = (long *)plVar1[1];
      *(long **)(lVar3 + 8) = plVar4;
      *plVar4 = lVar3;
      *plVar1 = 0;
      plVar1[1] = 0;
    }
    v.tag = -1;
    v.u.ptr = JVar2.ptr;
    JS_FreeValueRT(rt,v);
    (*(rt->mf).js_free)(&rt->malloc_state,plVar1);
    return;
  }
  return;
}

Assistant:

static void js_typed_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JSTypedArray *ta = p->u.typed_array;
    if (ta) {
        /* during the GC the finalizers are called in an arbitrary
           order so the ArrayBuffer finalizer may have been called */
        if (JS_IsLiveObject(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer))) {
            list_del(&ta->link);
        }
        JS_FreeValueRT(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
        js_free_rt(rt, ta);
    }
}